

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mult.hpp
# Opt level: O1

void calc_mean_and_sd_<float,int,long_double>
               (size_t *ix_arr,size_t st,size_t end,size_t col_num,float *Xc,int *Xc_ind,
               int *Xc_indptr,double *x_sd,double *x_mean)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong *puVar10;
  int *piVar11;
  long lVar12;
  ulong *puVar13;
  longdouble in_ST0;
  longdouble lVar14;
  longdouble in_ST1;
  longdouble lVar15;
  longdouble lVar16;
  double dVar17;
  ulong local_a0;
  
  lVar12 = (long)Xc_indptr[col_num];
  lVar4 = (long)Xc_indptr[col_num + 1];
  if (Xc_indptr[col_num] == Xc_indptr[col_num + 1]) {
    *x_sd = 0.0;
    *x_mean = 0.0;
  }
  else {
    puVar13 = ix_arr + st;
    puVar10 = ix_arr + end + 1;
    uVar6 = (long)puVar10 - (long)puVar13 >> 3;
    if (0 < (long)uVar6) {
      do {
        uVar5 = uVar6 >> 1;
        uVar9 = ~uVar5 + uVar6;
        uVar6 = uVar5;
        if (puVar13[uVar5] < (ulong)(long)Xc_ind[lVar12]) {
          puVar13 = puVar13 + uVar5 + 1;
          uVar6 = uVar9;
        }
      } while (0 < (long)uVar6);
    }
    local_a0 = (end - st) + 1;
    uVar6 = 0;
    lVar15 = (longdouble)0;
    lVar16 = lVar15;
    if ((puVar13 != puVar10) && (lVar4 != lVar12)) {
      iVar1 = Xc_ind[lVar4 + -1];
      lVar15 = (longdouble)0;
      uVar6 = 0;
      lVar16 = lVar15;
      while (uVar5 = *puVar13, uVar5 <= (ulong)(long)iVar1) {
        piVar11 = Xc_ind + lVar12;
        iVar2 = *piVar11;
        if (iVar2 == (int)uVar5) {
          if ((uint)ABS(Xc[lVar12]) < 0x7f800000) {
            uVar6 = uVar6 + 1;
            lVar16 = ((longdouble)Xc[lVar12] - lVar16) /
                     ((longdouble)(long)uVar6 + (longdouble)(float)(&DAT_0036b0d8)[(long)uVar6 < 0])
                     + lVar16;
            lVar14 = in_ST1;
            fmal();
            lVar15 = in_ST0;
            in_ST0 = in_ST1;
            in_ST1 = lVar14;
          }
          else {
            local_a0 = local_a0 - 1;
          }
          if ((puVar13 == ix_arr + end) || (lVar12 == lVar4 + -1)) break;
          piVar11 = piVar11 + 1;
          puVar13 = puVar13 + 1;
          uVar5 = (long)Xc_ind + (lVar4 * 4 - (long)piVar11) >> 2;
          if (0 < (long)uVar5) {
            do {
              uVar9 = uVar5 >> 1;
              uVar7 = ~uVar9 + uVar5;
              uVar5 = uVar9;
              if ((ulong)(long)(piVar11 + uVar9 + 1)[-1] < *puVar13) {
                piVar11 = piVar11 + uVar9 + 1;
                uVar5 = uVar7;
              }
            } while (0 < (long)uVar5);
          }
          lVar12 = (long)piVar11 - (long)Xc_ind >> 2;
        }
        else if ((int)uVar5 < iVar2) {
          puVar13 = puVar13 + 1;
          uVar5 = (long)puVar10 - (long)puVar13 >> 3;
          while (0 < (long)uVar5) {
            uVar9 = uVar5 >> 1;
            uVar7 = ~uVar9 + uVar5;
            uVar5 = uVar9;
            if (puVar13[uVar9] < (ulong)(long)iVar2) {
              puVar13 = puVar13 + uVar9 + 1;
              uVar5 = uVar7;
            }
          }
        }
        else {
          piVar3 = piVar11 + 1;
          uVar9 = (long)Xc_ind + (lVar4 * 4 - (long)(piVar11 + 1)) >> 2;
          while (0 < (long)uVar9) {
            uVar7 = uVar9 >> 1;
            uVar8 = ~uVar7 + uVar9;
            uVar9 = uVar7;
            if ((ulong)(long)(piVar3 + uVar7 + 1)[-1] < uVar5) {
              piVar3 = piVar3 + uVar7 + 1;
              uVar9 = uVar8;
            }
          }
          lVar12 = (long)piVar3 - (long)Xc_ind >> 2;
        }
        if ((puVar13 == puVar10) || (lVar12 == lVar4)) break;
      }
    }
    if (uVar6 == 0) {
      *x_mean = 0.0;
      dVar17 = 0.0;
    }
    else {
      if (uVar6 < local_a0) {
        lVar14 = ((longdouble)(long)uVar6 + (longdouble)(float)(&DAT_0036b0d8)[(long)uVar6 < 0]) /
                 ((longdouble)(long)local_a0 +
                 (longdouble)(float)(&DAT_0036b0d8)[(long)local_a0 < 0]);
        lVar15 = lVar16 * lVar16 *
                 ((longdouble)1 - lVar14) *
                 ((longdouble)(long)uVar6 + (longdouble)(float)(&DAT_0036b0d8)[(long)uVar6 < 0]) +
                 lVar15;
        lVar16 = lVar14 * lVar16;
      }
      *x_mean = (double)lVar16;
      dVar17 = (double)SQRT(lVar15 / ((longdouble)(long)local_a0 +
                                     (longdouble)(float)(&DAT_0036b0d8)[(long)local_a0 < 0]));
    }
    *x_sd = dVar17;
  }
  return;
}

Assistant:

void calc_mean_and_sd_(size_t *restrict ix_arr, size_t st, size_t end, size_t col_num,
                      real_t_ *restrict Xc, sparse_ix *restrict Xc_ind, sparse_ix *restrict Xc_indptr,
                      double &restrict x_sd, double &restrict x_mean)
{
    /* ix_arr must be already sorted beforehand */
    if (Xc_indptr[col_num] == Xc_indptr[col_num + 1])
    {
        x_sd   = 0;
        x_mean = 0;
        return;
    }
    size_t st_col  = Xc_indptr[col_num];
    size_t end_col = Xc_indptr[col_num + 1] - 1;
    size_t curr_pos = st_col;
    size_t ind_end_col = (size_t) Xc_ind[end_col];
    size_t *ptr_st = std::lower_bound(ix_arr + st, ix_arr + end + 1, (size_t)Xc_ind[st_col]);

    size_t cnt = end - st + 1;
    size_t added = 0;
    real_t m = 0;
    real_t s = 0;
    real_t m_prev = 0;

    for (size_t *row = ptr_st;
         row != ix_arr + end + 1 && curr_pos != end_col + 1 && ind_end_col >= *row;
        )
    {
        if (Xc_ind[curr_pos] == (sparse_ix)(*row))
        {
            if (unlikely(is_na_or_inf(Xc[curr_pos])))
            {
                cnt--;
            }

            else
            {
                if (added == 0) m_prev = Xc[curr_pos];
                m += (Xc[curr_pos] - m) / (real_t)(++added);
                s  = std::fma(Xc[curr_pos] - m, Xc[curr_pos] - m_prev, s);
                m_prev = m;
            }

            if (row == ix_arr + end || curr_pos == end_col) break;
            curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *(++row)) - Xc_ind;
        }

        else
        {
            if (Xc_ind[curr_pos] > (sparse_ix)(*row))
                row = std::lower_bound(row + 1, ix_arr + end + 1, Xc_ind[curr_pos]);
            else
                curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *row) - Xc_ind;
        }
    }

    if (added == 0)
    {
        x_mean = 0;
        x_sd = 0;
        return;
    }

    /* Note: up to this point:
         m = sum(x)/nnz
         s = sum(x^2) - (1/nnz)*(sum(x)^2)
       Here the standard deviation is given by:
         sigma = (1/n)*(sum(x^2) - (1/n)*(sum(x)^2))
       The difference can be put to a closed form. */
    if (cnt > added)
    {
        s += square(m) * ((real_t)added * ((real_t)1 - (real_t)added/(real_t)cnt));
        m *= (real_t)added / (real_t)cnt;
    }

    x_mean = m;
    x_sd   = std::sqrt(s / (real_t)cnt);
}